

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O0

int Export(WebPRescaler *rescaler,WEBP_CSP_MODE colorspace,int rgba_stride,uint8_t *rgba)

{
  int iVar1;
  long in_RCX;
  int in_EDX;
  long in_RDI;
  int num_lines_out;
  int dst_width;
  uint8_t *dst;
  uint32_t *src;
  int iVar2;
  int iVar3;
  uint32_t *in_data;
  
  in_data = *(uint32_t **)(in_RDI + 0x48);
  iVar3 = *(int *)(in_RDI + 0x34);
  iVar2 = 0;
  while( true ) {
    iVar1 = WebPRescalerHasPendingOutput((WebPRescaler *)CONCAT44(iVar3,iVar2));
    if (iVar1 == 0) break;
    WebPRescalerExportRow((WebPRescaler *)CONCAT44(iVar3,iVar2));
    (*WebPMultARGBRow)(in_data,iVar3,1);
    VP8LConvertFromBGRA(in_data,(int)((ulong)in_RCX >> 0x20),(WEBP_CSP_MODE)in_RCX,
                        (uint8_t *)CONCAT44(iVar3,iVar2));
    in_RCX = in_RCX + in_EDX;
    iVar2 = iVar2 + 1;
  }
  return iVar2;
}

Assistant:

static int Export(WebPRescaler* const rescaler, WEBP_CSP_MODE colorspace,
                  int rgba_stride, uint8_t* const rgba) {
  uint32_t* const src = (uint32_t*)rescaler->dst;
  uint8_t* dst = rgba;
  const int dst_width = rescaler->dst_width;
  int num_lines_out = 0;
  while (WebPRescalerHasPendingOutput(rescaler)) {
    WebPRescalerExportRow(rescaler);
    WebPMultARGBRow(src, dst_width, 1);
    VP8LConvertFromBGRA(src, dst_width, colorspace, dst);
    dst += rgba_stride;
    ++num_lines_out;
  }
  return num_lines_out;
}